

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjasm.cpp
# Opt level: O0

void __thiscall Options::COptionsParser::parseSyntaxValue(COptionsParser *this)

{
  char local_34 [3];
  undefined1 local_31;
  char this_option_is [2];
  char *pcStack_30;
  char this_option_is_1 [2];
  char *syntaxOption;
  char *__end2;
  char *__begin2;
  char (*__range2) [2048];
  COptionsParser *this_local;
  
  for (__end2 = this->val; (COptionsParser *)__end2 != this + 1; __end2 = __end2 + 1) {
    pcStack_30 = __end2;
    switch(*__end2) {
    case '\0':
      return;
    default:
      local_34[0] = *__end2;
      local_34[1] = 0;
      Error("Unrecognized syntax option",local_34,PASS03);
      break;
    case 'B':
      DAT_001e16a8._0_4_ = 2;
      break;
    case 'F':
      DAT_001e169a = 0;
      break;
    case 'L':
    case 'l':
      local_34[2] = *__end2;
      local_31 = 0;
      Error("Syntax option not implemented yet",local_34 + 2,PASS03);
      break;
    case 'M':
      DAT_001e16a6 = 1;
      break;
    case 'a':
      DAT_001e16b0 = doubleComma;
      break;
    case 'b':
      DAT_001e16a8._0_4_ = 1;
      break;
    case 'f':
      DAT_001e169b = 1;
      DAT_001e169a = 1;
      break;
    case 'i':
      DAT_001e16a4 = 1;
      break;
    case 's':
      DAT_001e16a7 = 0;
      break;
    case 'w':
      DAT_001e16a5 = 1;
    }
  }
  return;
}

Assistant:

void parseSyntaxValue() {
			// Options::syx is expected to be already in default state before entering this
			for (const auto & syntaxOption : val) {
				switch (syntaxOption) {
				case 0:   return;
				// f F - instructions: fake warning, no fakes (default = fake enabled)
				case 'f': syx.FakeEnabled = syx.FakeWarning = true; break;
				case 'F': syx.FakeEnabled = false; break;
				// a - multi-argument delimiter ",," (default is ",")
				case 'a': syx.MultiArg = &doubleComma; break;
				// b - single parentheses enforce mem access (default = relaxed syntax)
				case 'b': syx.MemoryBrackets = 1; break;
				// B - memory access brackets [] required (default = relaxed syntax)
				case 'B': syx.MemoryBrackets = 2; break;
				// l L - warn/error about labels using keywords (default = no message)
				case 'l':
				case 'L':
				{
					const char this_option_is[2] = { syntaxOption, 0 };
					Error("Syntax option not implemented yet", this_option_is, PASS03);
					break;
				}
				// i - case insensitive instructions/directives (default = same case required)
				case 'i': syx.CaseInsensitiveInstructions = true; break;
				// w - warnings option: report warnings as errors
				case 'w': syx.WarningsAsErrors = true; break;
				// M - alias "m" and "M" for "(hl)" to cover 8080-like syntax: ADD A,M
				case 'M': syx.Is_M_Memory = true; break;
				// s - switch off sub-word substitution in DEFINEs (s like "Simple defines" or "Sub word")
				case 's': syx.IsSubwordSubstitution = false; break;
				// unrecognized option
				default:
					const char this_option_is[2] = { syntaxOption, 0 };
					Error("Unrecognized syntax option", this_option_is, PASS03);
					break;
				}
			}
		}